

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O1

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::GetCallApplyTargetInlinee
          (FunctionCodeGenRuntimeData *this,ProfileId callApplyCallSiteId)

{
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar1;
  FunctionCodeGenRuntimeData *pFVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  FunctionCodeGenRuntimeData *local_28;
  
  uVar5 = FunctionBody::GetCountField((this->functionBody).ptr,ProfiledCallApplyCallSiteCount);
  if ((ushort)uVar5 <= callApplyCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0xc5,
                                "(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount())"
                                ,
                                "callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount()"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pWVar1 = (this->callApplyTargetInlinees).ptr;
  if (pWVar1 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    local_28 = (FunctionCodeGenRuntimeData *)0x0;
  }
  else {
    pFVar2 = pWVar1[callApplyCallSiteId].ptr;
    Memory::Recycler::WBSetBit((char *)&local_28);
    local_28 = pFVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_28);
  }
  return local_28;
}

Assistant:

const FunctionCodeGenRuntimeData * FunctionCodeGenRuntimeData::GetCallApplyTargetInlinee(const ProfileId callApplyCallSiteId) const
    {
        Assert(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount());

        return callApplyTargetInlinees ? callApplyTargetInlinees[callApplyCallSiteId] : nullptr;
    }